

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

uint64_t shuff_one_pass_freq_count
                   (uint32_t *input_u32,uint64_t input_size,uint64_t *freq,uint64_t *syms,
                   uint64_t ms)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  long lVar3;
  uint64_t *puVar4;
  ulong uVar5;
  
  if (-1 < (long)ms) {
    puVar2 = (uint64_t *)((long)freq + ms * 8 + 1);
    puVar4 = freq + 1;
    if (freq + 1 < puVar2) {
      puVar4 = puVar2;
    }
    memset(freq,0,(~(ulong)freq + (long)puVar4 & 0xfffffffffffffff8) + 8);
  }
  if ((long)input_size < 1) {
    lVar3 = 0;
  }
  else {
    puVar1 = input_u32 + input_size;
    lVar3 = 0;
    do {
      uVar5 = (ulong)(*input_u32 + 1);
      if (freq[uVar5] == 0) {
        syms[lVar3] = uVar5;
        lVar3 = lVar3 + 1;
      }
      freq[uVar5] = freq[uVar5] + 1;
      input_u32 = input_u32 + 1;
    } while (input_u32 < puVar1);
  }
  *freq = 1;
  syms[lVar3] = 0;
  return lVar3 + 1;
}

Assistant:

uint64_t shuff_one_pass_freq_count(const uint32_t* input_u32,
    uint64_t input_size, uint64_t* freq, uint64_t* syms, uint64_t ms)
{
    uint64_t n;
    uint64_t* up;
    const uint32_t* cup;

    /* clear all elements up to max_symbol = ms */
    for (up = freq; up <= freq + ms; up++)
        *up = 0;

    n = 0;
    for (cup = input_u32; cup < input_u32 + input_size; cup++) {
        if (freq[*cup + 1] == 0)
            syms[n++] = *cup + 1;
        freq[*cup + 1]++;
    }
    freq[0] = 1;
    syms[n++] = 0;

    return n;
}